

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notifier.hpp
# Opt level: O3

void __thiscall tf::Notifier::cancel_wait(Notifier *this,Waiter *w)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = (ulong)((uint)w->epoch & 0xffff0000) * 0x10000 + (w->epoch & 0xffffffff00000000);
  uVar1 = (this->_state).super___atomic_base<unsigned_long>._M_i;
  do {
    while ((long)(uVar1 - uVar3) < 0) {
      sched_yield();
      uVar1 = (this->_state).super___atomic_base<unsigned_long>._M_i;
    }
    if ((uVar1 & 0xffffffff00000000) != uVar3) {
      return;
    }
    if ((short)(uVar1 >> 0x10) == 0) {
      __assert_fail("(state & kWaiterMask) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/taskflow/taskflow/core/notifier.hpp"
                    ,0x9a,"void tf::Notifier::cancel_wait(Waiter *)");
    }
    LOCK();
    uVar2 = (this->_state).super___atomic_base<unsigned_long>._M_i;
    bVar4 = uVar1 == uVar2;
    if (bVar4) {
      (this->_state).super___atomic_base<unsigned_long>._M_i = uVar1 + 0xffff0000;
      uVar2 = uVar1;
    }
    UNLOCK();
    uVar1 = uVar2;
  } while (!bVar4);
  return;
}

Assistant:

void cancel_wait(Waiter* w) {
    uint64_t epoch =
        (w->epoch & kEpochMask) +
        (((w->epoch & kWaiterMask) >> kWaiterShift) << kEpochShift);
    uint64_t state = _state.load(std::memory_order_relaxed);
    for (;;) {
      if (int64_t((state & kEpochMask) - epoch) < 0) {
        // The preceeding waiter has not decided on its fate. Wait until it
        // calls either cancel_wait or commit_wait, or is notified.
        std::this_thread::yield();
        state = _state.load(std::memory_order_relaxed);
        continue;
      }
      // We've already been notified.
      if (int64_t((state & kEpochMask) - epoch) > 0) return;
      // Remove this thread from prewait counter.
      assert((state & kWaiterMask) != 0);
      if (_state.compare_exchange_weak(state, state - kWaiterInc + kEpochInc,
                                       std::memory_order_relaxed))
        return;
    }
  }